

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

int fft_segment_fwd(mixed_segment *segment)

{
  undefined1 (*pauVar1) [32];
  float fVar2;
  undefined8 uVar3;
  uint n;
  uint uVar4;
  undefined8 *puVar5;
  long lVar6;
  float *pSrc;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t size;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  double __x;
  undefined1 auVar21 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  uint32_t out_samples;
  uint32_t in_samples;
  float *out;
  float *in;
  uint local_e0;
  uint32_t local_dc;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  float *local_98;
  float *local_90;
  double local_88;
  undefined8 uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  puVar5 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar5 + 0x14);
  uVar15 = (ulong)n;
  uVar4 = *(uint *)(puVar5 + 3);
  lVar6 = puVar5[5];
  pSrc = (float *)puVar5[6];
  lVar7 = puVar5[7];
  local_dc = 0xffffffff;
  mixed_buffer_request_read(&local_90,&local_dc,(mixed_buffer *)*puVar5);
  size = 0;
  uVar16 = uVar15 / uVar4;
  local_d8 = uVar15 - uVar16;
  if (puVar5[4] == 0) {
    puVar5[4] = local_d8;
  }
  if (local_dc != 0) {
    local_b8 = (double)uVar15;
    local_a0 = (double)*(uint *)(puVar5 + 2) / local_b8;
    local_a8 = ((double)uVar16 * 6.283185307179586) / local_b8;
    local_b0 = (double)uVar4;
    auVar23 = ZEXT1664(CONCAT88(in_XMM4_Qa,local_b0));
    local_d0 = local_d8 + 7U & 0x7ffffffffffffff8;
    uStack_60 = local_d8 - 1;
    uVar14 = 0;
    local_78 = uStack_60 ^ 0x8000000000000000;
    uStack_70 = uStack_60 ^ 0x8000000000000000;
    uStack_68 = uStack_60 ^ 0x8000000000000000;
    uStack_60 = uStack_60 ^ 0x8000000000000000;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    uStack_48 = 0x8000000000000000;
    uStack_40 = 0x8000000000000000;
    size = local_dc;
    local_c8 = uVar16;
    do {
      lVar13 = puVar5[4];
      *(float *)(lVar6 + lVar13 * 4) = local_90[uVar14];
      lVar13 = lVar13 + 1;
      puVar5[4] = lVar13;
      if ((long)uVar15 <= lVar13) {
        auVar23 = ZEXT1664(auVar23._0_16_);
        local_e0 = n;
        local_c0 = uVar14;
        mixed_buffer_clear((mixed_buffer *)puVar5[1]);
        mixed_buffer_request_write(&local_98,&local_e0,(mixed_buffer *)puVar5[1]);
        puVar5[4] = local_d8;
        if (n != 0) {
          uVar16 = 0;
          do {
            dVar17 = cos(((double)(long)uVar16 * 6.283185307179586) / local_b8);
            pSrc[uVar16 * 2] =
                 (float)((dVar17 * -0.5 + 0.5) * (double)*(float *)(lVar6 + uVar16 * 4));
            pSrc[uVar16 * 2 + 1] = 0.0;
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        spiral_fft_float(n,-1,pSrc,pSrc);
        lVar13 = 0;
        do {
          __x = (double)pSrc[lVar13 * 2];
          dVar17 = (double)pSrc[lVar13 * 2 + 1];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = __x * __x + dVar17 * dVar17;
          auVar21 = vsqrtsd_avx(auVar21,auVar21);
          local_88 = auVar21._0_8_ + auVar21._0_8_;
          uStack_80 = 0;
          dVar17 = atan2(dVar17,__x);
          auVar22 = auVar23._0_32_;
          fVar2 = *(float *)(lVar7 + lVar13 * 4);
          *(float *)(lVar7 + lVar13 * 4) = (float)dVar17;
          dVar17 = (dVar17 - (double)fVar2) - (double)lVar13 * local_a8;
          uVar14 = (ulong)(dVar17 / 3.141592653589793);
          uVar16 = uVar14 & 0xfffffffffffffffe;
          if (-1 < (long)uVar14) {
            uVar16 = ((uint)uVar14 & 1) + uVar14;
          }
          auVar10._8_8_ = uStack_80;
          auVar10._0_8_ = local_88;
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               (double)lVar13 * local_a0 +
               local_a0 *
               ((((double)(long)uVar16 * -3.141592653589793 + dVar17) * local_b0) /
               6.283185307179586);
          auVar21 = vunpcklpd_avx(auVar18,auVar10);
          auVar21 = vcvtpd2ps_avx(auVar21);
          uVar3 = vmovlpd_avx(auVar21);
          *(undefined8 *)(local_98 + lVar13 * 2) = uVar3;
          lVar13 = lVar13 + 1;
        } while ((ulong)(n >> 1) + 1 != lVar13);
        mixed_buffer_finish_write(local_e0,(mixed_buffer *)puVar5[1]);
        auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar12._8_8_ = uStack_50;
        auVar12._0_8_ = local_58;
        auVar12._16_8_ = uStack_48;
        auVar12._24_8_ = uStack_40;
        auVar11._8_8_ = uStack_70;
        auVar11._0_8_ = local_78;
        auVar11._16_8_ = uStack_68;
        auVar11._24_8_ = uStack_60;
        auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
        auVar23 = ZEXT3264(auVar22);
        uVar14 = local_c0;
        size = local_dc;
        if (0 < local_d8) {
          uVar16 = 0;
          do {
            auVar19._8_8_ = uVar16;
            auVar19._0_8_ = uVar16;
            auVar19._16_8_ = uVar16;
            auVar19._24_8_ = uVar16;
            auVar20 = vpor_avx2(auVar19,auVar8);
            auVar19 = vpor_avx2(auVar19,auVar9);
            auVar19 = vpcmpgtq_avx2(auVar19 ^ auVar12,auVar11);
            auVar20 = vpcmpgtq_avx2(auVar20 ^ auVar12,auVar11);
            auVar19 = vpackssdw_avx2(auVar20,auVar19);
            auVar21 = vpackssdw_avx(SUB3216(auVar19 ^ auVar22,0),SUB3216(auVar19 ^ auVar22,0x10));
            auVar21 = vpshufd_avx(auVar21,0xd8);
            auVar19 = vpmovzxwd_avx2(auVar21);
            auVar20 = vpslld_avx2(auVar19,0x1f);
            pauVar1 = (undefined1 (*) [32])(lVar6 + uVar16 * 4);
            auVar19 = vmaskmovps_avx(auVar20,*(undefined1 (*) [32])(*pauVar1 + local_c8 * 4));
            auVar19 = vmaskmovps_avx(auVar20,auVar19);
            *pauVar1 = auVar19;
            uVar16 = uVar16 + 8;
          } while (local_d0 != uVar16);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < size);
  }
  mixed_buffer_finish_read(size,(mixed_buffer *)*puVar5);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}